

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warptexture.cpp
# Opt level: O0

int __thiscall FWarpTexture::NextPo2(FWarpTexture *this,int v)

{
  uint uVar1;
  int v_local;
  FWarpTexture *this_local;
  
  uVar1 = (int)(v - 1U) >> 1 | v - 1U;
  uVar1 = (int)uVar1 >> 2 | uVar1;
  uVar1 = (int)uVar1 >> 4 | uVar1;
  uVar1 = (int)uVar1 >> 8 | uVar1;
  return ((int)uVar1 >> 0x10 | uVar1) + 1;
}

Assistant:

int FWarpTexture::NextPo2 (int v)
{
	v--;
	v |= v >> 1;
	v |= v >> 2;
	v |= v >> 4;
	v |= v >> 8;
	v |= v >> 16;
	return ++v;
}